

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O1

Port * __thiscall
kratos::Generator::port
          (Generator *this,PortDirection direction,string *port_name,uint32_t width,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *size,PortType type,bool is_signed)

{
  Port *pPVar1;
  Generator *local_58;
  PortDirection local_4c;
  uint32_t local_48;
  PortDirection direction_local;
  uint32_t width_local;
  PortType type_local;
  shared_ptr<kratos::Port> p;
  bool is_signed_local;
  
  p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = is_signed
  ;
  _width_local = (Port *)0x0;
  local_58 = this;
  local_4c = direction;
  local_48 = width;
  direction_local = type;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::Port,std::allocator<kratos::Port>,kratos::Generator*,kratos::PortDirection&,std::__cxx11::string_const&,unsigned_int&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,kratos::PortType&,bool&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p,(Port **)&width_local,
             (allocator<kratos::Port> *)
             ((long)&p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi + 6),&local_58,&local_4c,port_name,&local_48,size,&direction_local,
             (bool *)((long)&p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi + 7));
  std::__shared_ptr<kratos::Port,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::Port,kratos::Port>
            ((__shared_ptr<kratos::Port,(__gnu_cxx::_Lock_policy)2> *)&width_local,_width_local);
  (*(this->super_IRNode)._vptr_IRNode[7])(this,port_name);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
  ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::Port>&>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
              *)&this->vars_,port_name,(shared_ptr<kratos::Port> *)&width_local);
  pPVar1 = _width_local;
  if (p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)
  {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               p.super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return pPVar1;
}

Assistant:

Port &Generator::port(PortDirection direction, const std::string &port_name, uint32_t width,
                      const std::vector<uint32_t> &size, PortType type, bool is_signed) {
    auto p = std::make_shared<Port>(this, direction, port_name, width, size, type, is_signed);
    add_port_name(port_name);
    vars_.emplace(port_name, p);
    return *p;
}